

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpConnection::connect_handler(TcpConnection *this,error_code *error)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  TriggerVariable *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  ostream *this_02;
  error_code *in_RSI;
  TcpConnection *in_RDI;
  stringstream str;
  undefined1 __i;
  TriggerVariable *in_stack_fffffffffffffe08;
  error_code *in_stack_fffffffffffffe18;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [376];
  error_code *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_198);
    this_00 = (TriggerVariable *)std::operator<<(local_188,"connection error ");
    std::error_code::message_abi_cxx11_(in_stack_fffffffffffffe18);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::operator<<((ostream *)this_00,local_1c8);
    this_02 = std::operator<<((ostream *)this_01,": code =");
    iVar2 = CLI::std::error_code::value((error_code *)local_10);
    std::ostream::operator<<(this_02,iVar2);
    __i = (undefined1)((ulong)this_02 >> 0x38);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::stringstream::str();
    logger(in_RDI,(int)((ulong)this_00 >> 0x20),(string *)this_01);
    std::__cxx11::string::~string(this_01);
    std::atomic<bool>::operator=((atomic<bool> *)this_01,(bool)__i);
    concurrency::TriggerVariable::activate(this_00);
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7bf773);
    (*peVar3->_vptr_Socket[6])();
    concurrency::TriggerVariable::activate(in_stack_fffffffffffffe08);
    peVar3 = std::
             __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7bf79b);
    (*peVar3->_vptr_Socket[0xc])(peVar3,1);
  }
  return;
}

Assistant:

void TcpConnection::connect_handler(const std::error_code& error)
{
    if (!error) {
        socket_->handshake();
        connected.activate();
        socket_->set_option_no_delay(true);
    } else {
        std::stringstream str;

        str << "connection error " << error.message()
            << ": code =" << error.value();
        logger(0, str.str());
        connectionError = true;
        connected.activate();
    }
}